

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupEx(ImGuiID id,ImGuiWindowFlags flags)

{
  bool bVar1;
  char local_38 [7];
  bool is_open;
  char name [20];
  ImGuiContext *g;
  ImGuiWindowFlags flags_local;
  ImGuiID id_local;
  
  stack0xffffffffffffffe0 = GImGui;
  bVar1 = IsPopupOpen(id,0);
  if (bVar1) {
    if ((flags & 0x10000000U) == 0) {
      ImFormatString(local_38,0x14,"##Popup_%08x",(ulong)id);
    }
    else {
      ImFormatString(local_38,0x14,"##Menu_%02d",
                     (ulong)(uint)(stack0xffffffffffffffe0->BeginPopupStack).Size);
    }
    flags_local._3_1_ = Begin(local_38,(bool *)0x0,flags | 0x4200000);
    if (!flags_local._3_1_) {
      EndPopup();
    }
  }
  else {
    ImGuiNextWindowData::ClearFlags(&stack0xffffffffffffffe0->NextWindowData);
    flags_local._3_1_ = false;
  }
  return flags_local._3_1_;
}

Assistant:

bool ImGui::BeginPopupEx(ImGuiID id, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    if (!IsPopupOpen(id, ImGuiPopupFlags_None))
    {
        g.NextWindowData.ClearFlags(); // We behave like Begin() and need to consume those values
        return false;
    }

    char name[20];
    if (flags & ImGuiWindowFlags_ChildMenu)
        ImFormatString(name, IM_ARRAYSIZE(name), "##Menu_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth
    else
        ImFormatString(name, IM_ARRAYSIZE(name), "##Popup_%08x", id); // Not recycling, so we can close/open during the same frame

    flags |= ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoDocking;
    bool is_open = Begin(name, NULL, flags);
    if (!is_open) // NB: Begin can return false when the popup is completely clipped (e.g. zero size display)
        EndPopup();

    return is_open;
}